

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock_updates.cc
# Opt level: O1

clock_update_t *
tchecker::operator+(clock_update_t *__return_storage_ptr__,clock_update_t *u,
                   shared_ptr<const_tchecker::expression_t> *expr)

{
  clock_id_t clock_id;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  undefined1 local_41;
  binary_expression_t *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  binary_operator_t local_2c;
  shared_ptr<const_tchecker::expression_t> local_28;
  
  clock_id = u->_clock_id;
  local_2c = EXPR_OP_PLUS;
  local_40 = (binary_expression_t *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<tchecker::binary_expression_t,std::allocator<tchecker::binary_expression_t>,tchecker::binary_operator_t,std::shared_ptr<tchecker::expression_t_const>const&,std::shared_ptr<tchecker::expression_t_const>const&>
            (&_Stack_38,&local_40,(allocator<tchecker::binary_expression_t> *)&local_41,&local_2c,
             &u->_value,expr);
  this._M_pi = _Stack_38._M_pi;
  if (local_40 == (binary_expression_t *)0x0) {
    local_28.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    local_28.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)((long)&local_40->field_0x0 + *(long *)(*(long *)local_40 + -0x38));
  }
  local_28.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_38._M_pi;
  local_40 = (binary_expression_t *)0x0;
  _Stack_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  clock_update_t::clock_update_t(__return_storage_ptr__,clock_id,&local_28);
  if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
  }
  if (_Stack_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_38._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

tchecker::clock_update_t operator+(tchecker::clock_update_t const & u,
                                   std::shared_ptr<tchecker::expression_t const> const & expr)
{
  return tchecker::clock_update_t{u._clock_id,
                                  std::make_shared<tchecker::binary_expression_t>(tchecker::EXPR_OP_PLUS, u._value, expr)};
}